

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Tags::~Tags(Tags *this)

{
  int iVar1;
  Tag *pTVar2;
  Tag *this_00;
  long in_RDI;
  Tag *t;
  
  while (0 < *(int *)(in_RDI + 0x34)) {
    iVar1 = *(int *)(in_RDI + 0x34);
    *(int *)(in_RDI + 0x34) = iVar1 + -1;
    Tag::Clear((Tag *)((long)iVar1 * 0x10 + -0x10 + *(long *)(in_RDI + 0x28)));
  }
  pTVar2 = *(Tag **)(in_RDI + 0x28);
  if (pTVar2 != (Tag *)0x0) {
    this_00 = pTVar2 + *(long *)&pTVar2[-1].m_simple_tags_size;
    while (pTVar2 != this_00) {
      this_00 = this_00 + -1;
      Tag::~Tag(this_00);
    }
    operator_delete__(&pTVar2[-1].m_simple_tags_size);
  }
  return;
}

Assistant:

Tags::~Tags() {
  while (m_tags_count > 0) {
    Tag& t = m_tags[--m_tags_count];
    t.Clear();
  }
  delete[] m_tags;
}